

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftmgr.c
# Opt level: O1

void ftmgr_timedout(ftmgr *ftmgr)

{
  byte bVar1;
  char cVar2;
  __ftb *p_Var3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  char cVar8;
  
  p_Var3 = ftmgr->ftq;
  bVar1 = ftmgr->bitmap;
  uVar5 = 0xffffffff;
  lVar4 = 0;
  cVar7 = '\0';
  do {
    cVar8 = p_Var3->tts + -1;
    cVar2 = cVar8;
    if (cVar7 < cVar8) {
      cVar2 = cVar7;
    }
    uVar6 = uVar5;
    if (cVar8 < cVar7) {
      uVar6 = (uint)lVar4;
    }
    if ((bVar1 >> ((uint)lVar4 & 0x1f) & 1) == 0) {
      cVar7 = cVar2;
      uVar5 = uVar6;
    }
    p_Var3->tts = cVar8;
    lVar4 = lVar4 + 1;
    p_Var3 = p_Var3 + 1;
  } while (lVar4 != 8);
  if (uVar5 != 0xffffffff) {
    ftmgr->ftq[(int)uVar5].tts = ftmgr->tts;
    fm_write(ftmgr->chmgr,(char)uVar5 + ' ',ftmgr->ftq[(int)uVar5].blk,ftmgr->ftq[(int)uVar5].size);
    return;
  }
  return;
}

Assistant:

void ftmgr_timedout(struct ftmgr *ftmgr)
{
    int seq = -1, tts = 0;
    for(int i = 0;i < FTQ_NR;i++) {
        ftmgr->ftq[i].tts--;
        if(!(ftmgr->bitmap & (1 << i)) && ftmgr->ftq[i].tts < tts) {
            seq = i;
            tts = ftmgr->ftq[i].tts;
        }
    }

    if(seq != -1) {
        ftmgr->ftq[seq].tts = ftmgr->tts;
        fm_write(ftmgr->chmgr, CTRL_BLK_SEQ0 + seq, ftmgr->ftq[seq].blk, ftmgr->ftq[seq].size);
    }
}